

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalMapping::MergeFrom
          (CategoricalMapping *this,CategoricalMapping *from)

{
  uint32_t uVar1;
  ulong uVar2;
  LogMessage *other;
  Int64ToStringMap *pIVar3;
  StringToInt64Map *pSVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  undefined8 *puVar8;
  ValueOnUnknownUnion VVar9;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/CategoricalMapping.pb.cc"
               ,399);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_MappingType(this);
      this->_oneof_case_[0] = 1;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pSVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringToInt64Map>
                         (pAVar7);
      (this->MappingType_).stringtoint64map_ = pSVar4;
    }
    if (from->_oneof_case_[0] == 1) {
      puVar6 = (undefined1 *)(from->MappingType_).stringtoint64map_;
    }
    else {
      puVar6 = _StringToInt64Map_default_instance_;
    }
    StringToInt64Map::MergeFrom((this->MappingType_).stringtoint64map_,(StringToInt64Map *)puVar6);
  }
  else if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_MappingType(this);
      this->_oneof_case_[0] = 2;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pIVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64ToStringMap>
                         (pAVar7);
      (this->MappingType_).int64tostringmap_ = pIVar3;
    }
    if (from->_oneof_case_[0] == 2) {
      puVar6 = (undefined1 *)(from->MappingType_).int64tostringmap_;
    }
    else {
      puVar6 = _Int64ToStringMap_default_instance_;
    }
    Int64ToStringMap::MergeFrom((this->MappingType_).int64tostringmap_,(Int64ToStringMap *)puVar6);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x66) {
    if (uVar1 == 0x66) {
      VVar9 = from->ValueOnUnknown_;
    }
    else {
      VVar9.int64value_ = 0;
    }
    if (this->_oneof_case_[1] != 0x66) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x66;
    }
    this->ValueOnUnknown_ = VVar9;
  }
  else if (uVar1 == 0x65) {
    if (uVar1 == 0x65) {
      puVar8 = (undefined8 *)((from->ValueOnUnknown_).int64value_ & 0xfffffffffffffffe);
    }
    else {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[1] != 0x65) {
      clear_ValueOnUnknown(this);
      this->_oneof_case_[1] = 0x65;
      (this->ValueOnUnknown_).int64value_ =
           (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->ValueOnUnknown_,puVar8,puVar5);
  }
  uVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void CategoricalMapping::MergeFrom(const CategoricalMapping& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalMapping)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      _internal_mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from._internal_stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      _internal_mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from._internal_int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      _internal_set_strvalue(from._internal_strvalue());
      break;
    }
    case kInt64Value: {
      _internal_set_int64value(from._internal_int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}